

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.h
# Opt level: O0

void __thiscall Diligent::ITexture::ITexture(ITexture *this)

{
  ITexture *this_local;
  
  IDeviceObject::IDeviceObject(&this->super_IDeviceObject);
  (this->super_IDeviceObject).super_IObject._vptr_IObject =
       (_func_int **)&PTR___cxa_pure_virtual_00593470;
  return;
}

Assistant:

DILIGENT_BEGIN_INTERFACE(ITexture, IDeviceObject)
{
#if DILIGENT_CPP_INTERFACE
    /// Returns the texture description used to create the object
    virtual const TextureDesc& METHOD(GetDesc)()const override = 0;
#endif

    /// Creates a new texture view

    /// \param [in] ViewDesc - View description. See Diligent::TextureViewDesc for details.
    /// \param [out] ppView - Address of the memory location where the pointer to the view interface will be written to.
    ///
    /// To create a shader resource view addressing the entire texture, set only TextureViewDesc::ViewType
    /// member of the ViewDesc parameter to Diligent::TEXTURE_VIEW_SHADER_RESOURCE and leave all other
    /// members in their default values. Using the same method, you can create render target or depth stencil
    /// view addressing the largest mip level.
    ///
    /// If texture view format is Diligent::TEX_FORMAT_UNKNOWN, the view format will match the texture format.
    /// 
    /// If texture view type is Diligent::TEXTURE_VIEW_UNDEFINED, the type will match the texture type.
    /// If the number of mip levels is 0, and the view type is shader resource, the view will address all mip levels.
    ///
    /// For other view types it will address one mip level.
    ///
    /// If the number of slices is 0, all slices from FirstArraySlice or FirstDepthSlice will be referenced by the view.
    /// For non-array textures, the only allowed values for the number of slices are 0 and 1.
    ///
    /// Texture view will contain strong reference to the texture, so the texture will not be destroyed
    /// until all views are released.
    ///
    /// The function calls AddRef() for the created interface, so it must be released by
    /// a call to Release() when it is no longer needed.
    VIRTUAL void METHOD(CreateView)(THIS_
                                    const TextureViewDesc REF ViewDesc,
                                    ITextureView**            ppView) PURE;

    /// Returns the pointer to the default view.

    /// \param [in] ViewType - Type of the requested view. See Diligent::TEXTURE_VIEW_TYPE.
    /// \return Pointer to the interface
    ///
    /// \note The function does **not** increase the reference counter for the returned interface, so
    ///       Release() **must not** be called.
    VIRTUAL ITextureView* METHOD(GetDefaultView)(THIS_
                                                 TEXTURE_VIEW_TYPE ViewType) PURE;


    /// Returns native texture handle specific to the underlying graphics API

    /// \return A pointer to `ID3D11Resource` interface, for D3D11 implementation\n
    ///         A pointer to `ID3D12Resource` interface, for D3D12 implementation\n
    ///         `VkImage` handle, for Vulkan implementation\n
    ///         GL texture name, for OpenGL implementation\n
    ///         `MtlTexture`, for Metal implementation\n
    ///         `WGPUTexture` for WebGPU implementation
    VIRTUAL Uint64 METHOD(GetNativeHandle)(THIS) PURE;

    /// Sets the usage state for all texture subresources.

    /// This method does not perform state transition, but
    /// resets the internal texture state to the given value.
    /// This method should be used after the application finished
    /// manually managing the texture state and wants to hand over
    /// state management back to the engine.
    VIRTUAL void METHOD(SetState)(THIS_
                                  RESOURCE_STATE State) PURE;

    /// Returns the internal texture state
    VIRTUAL RESOURCE_STATE METHOD(GetState)(THIS) CONST PURE;

    /// Returns the sparse texture properties, see Diligent::SparseTextureProperties.
    VIRTUAL const SparseTextureProperties REF METHOD(GetSparseProperties)(THIS) CONST PURE;
}